

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

string * __thiscall
t_java_generator::make_valid_java_identifier
          (string *__return_storage_ptr__,t_java_generator *this,string *fromName)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  size_t i;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)fromName);
  if (__return_storage_ptr__->_M_string_length != 0) {
    pcVar2 = (char *)std::__cxx11::string::at((ulong)__return_storage_ptr__);
    if ((byte)(*pcVar2 - 0x30U) < 10) {
      std::operator+(&local_40,"_",__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    for (uVar4 = 0; uVar4 < __return_storage_ptr__->_M_string_length; uVar4 = uVar4 + 1) {
      pbVar3 = (byte *)std::__cxx11::string::at((ulong)__return_storage_ptr__);
      bVar1 = *pbVar3;
      if (((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6) && (bVar1 != 0x5f && (byte)(bVar1 - 0x3a) < 0xf6))
      {
        std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar4,(char *)0x1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_java_generator::make_valid_java_identifier(std::string const& fromName) {
  std::string str = fromName;
  if (str.empty()) {
    return str;
  }

  // tests rely on this
  assert(('A' < 'Z') && ('a' < 'z') && ('0' < '9'));

  // if the first letter is a number, we add an additional underscore in front of it
  char c = str.at(0);
  if (('0' <= c) && (c <= '9')) {
    str = "_" + str;
  }

  // following chars: letter, number or underscore
  for (size_t i = 0; i < str.size(); ++i) {
    c = str.at(i);
    if ((('A' > c) || (c > 'Z')) && (('a' > c) || (c > 'z')) && (('0' > c) || (c > '9'))
        && ('_' != c)) {
      str.replace(i, 1, "_");
    }
  }

  return str;
}